

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::dotSI8x16toI16x8Add
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Type *__return_storage_ptr___00;
  reference this_00;
  reference other;
  reference this_01;
  Literal local_1a8;
  Literal local_190;
  ulong local_178;
  size_t i;
  LaneArray<4> dest;
  undefined1 local_100 [8];
  LaneArray<8> tempLanes;
  Literal temp;
  Literal *right_local;
  Literal *left_local;
  Literal *this_local;
  
  __return_storage_ptr___00 = &tempLanes._M_elems[7].type;
  dotSI8x16toI16x8((Literal *)__return_storage_ptr___00,this,left);
  getLanesSI16x8((LaneArray<8> *)local_100,(Literal *)__return_storage_ptr___00);
  std::array<wasm::Literal,_4UL>::array((array<wasm::Literal,_4UL> *)&i);
  for (local_178 = 0; local_178 < 4; local_178 = local_178 + 1) {
    this_00 = std::array<wasm::Literal,_8UL>::operator[]
                        ((array<wasm::Literal,_8UL> *)local_100,local_178 * 2);
    other = std::array<wasm::Literal,_8UL>::operator[]
                      ((array<wasm::Literal,_8UL> *)local_100,local_178 * 2 + 1);
    add(&local_190,this_00,other);
    this_01 = std::array<wasm::Literal,_4UL>::operator[]((array<wasm::Literal,_4UL> *)&i,local_178);
    operator=(this_01,&local_190);
    ~Literal(&local_190);
  }
  Literal(&local_1a8,(LaneArray<4> *)&i);
  addI32x4(__return_storage_ptr__,&local_1a8,right);
  ~Literal(&local_1a8);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&i);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_100);
  ~Literal((Literal *)&tempLanes._M_elems[7].type);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::dotSI8x16toI16x8Add(const Literal& left,
                                     const Literal& right) const {
  auto temp = dotSI8x16toI16x8(left);

  auto tempLanes = temp.getLanesSI16x8();
  LaneArray<4> dest;
  // TODO: the index on dest may be wrong, see
  //       https://github.com/WebAssembly/relaxed-simd/issues/162
  for (size_t i = 0; i < 4; i++) {
    dest[i] = tempLanes[i * 2].add(tempLanes[i * 2 + 1]);
  }

  return Literal(dest).addI32x4(right);
}